

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

Property *
Rml::ElementStyle::GetLocalProperty
          (PropertyId id,PropertyDictionary *inline_properties,ElementDefinition *definition)

{
  Property *property;
  ElementDefinition *definition_local;
  PropertyDictionary *inline_properties_local;
  Property *pPStack_10;
  PropertyId id_local;
  
  pPStack_10 = PropertyDictionary::GetProperty(inline_properties,id);
  if (pPStack_10 == (Property *)0x0) {
    if (definition == (ElementDefinition *)0x0) {
      pPStack_10 = (Property *)0x0;
    }
    else {
      pPStack_10 = ElementDefinition::GetProperty(definition,id);
    }
  }
  return pPStack_10;
}

Assistant:

const Property* ElementStyle::GetLocalProperty(PropertyId id, const PropertyDictionary& inline_properties, const ElementDefinition* definition)
{
	// Check for overriding local properties.
	const Property* property = inline_properties.GetProperty(id);
	if (property)
		return property;

	// Check for a property defined in an RCSS rule.
	if (definition)
		return definition->GetProperty(id);

	return nullptr;
}